

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cutNode.c
# Opt level: O3

int Cut_CutListVerify(Cut_Cut_t *pList)

{
  Cut_Cut_t **ppCVar1;
  Cut_Cut_t *pCVar2;
  Cut_Cut_t *pCut_00;
  Cut_Cut_t *pCut;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  
  pCVar2 = pList;
  if (pList != (Cut_Cut_t *)0x0) {
    do {
      pCut_00 = pList;
      if (pCVar2 != pList) {
        do {
          if (*(uint *)pCut_00 < 0x10000000) {
LAB_00454835:
            puts("******************* These are contained cuts:");
            Cut_CutPrint(pCut_00,1);
            Cut_CutPrint(pCut_00,1);
            return 0;
          }
          uVar3 = *(uint *)pCVar2 >> 0x1c;
          uVar4 = 0;
          while( true ) {
            uVar5 = 0;
            if (0xfffffff < *(uint *)pCVar2) {
              uVar5 = 0;
              while (*(uint *)(&pCut_00[1].field_0x0 + uVar4 * 4) !=
                     *(uint *)((long)&pCVar2[1].field_0x0 + uVar5 * 4)) {
                uVar5 = uVar5 + 1;
                if (uVar3 == uVar5) goto LAB_00454821;
              }
            }
            if ((uint)uVar5 == uVar3) break;
            uVar4 = uVar4 + 1;
            if (uVar4 == *(uint *)pCut_00 >> 0x1c) goto LAB_00454835;
          }
LAB_00454821:
          ppCVar1 = &pCut_00->pNext;
          pCut_00 = *ppCVar1;
        } while (*ppCVar1 != pCVar2);
      }
      ppCVar1 = &pCVar2->pNext;
      pCVar2 = *ppCVar1;
    } while (*ppCVar1 != (Cut_Cut_t *)0x0);
  }
  return 1;
}

Assistant:

int Cut_CutListVerify( Cut_Cut_t * pList )
{ 
    Cut_Cut_t * pCut, * pDom;
    Cut_ListForEachCut( pList, pCut )
    {
        Cut_ListForEachCutStop( pList, pDom, pCut )
        {
            if ( Cut_CutCheckDominance( pDom, pCut ) )
            {
                printf( "******************* These are contained cuts:\n" );
                Cut_CutPrint( pDom, 1 );
                Cut_CutPrint( pDom, 1 );
                return 0;
            }
        }
    }
    return 1;
}